

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::StartsWithOperator,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  byte bVar4;
  undefined1 auVar5 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  ulong uVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  char *__s2;
  char *pcVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  bool bVar16;
  undefined1 local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  bool *local_68;
  undefined8 local_60;
  char *local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  ulong local_48;
  string_t *local_40;
  string_t *local_38;
  
  local_68 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar13 = 0;
      local_40 = rdata;
      local_38 = ldata;
      do {
        uVar9 = uVar13;
        if (psVar1 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar1[uVar13];
        }
        uVar12 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar2[uVar13];
        }
        local_78 = *(undefined1 (*) [8])&ldata[uVar9].value;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar9].value.pointer.ptr;
        local_60 = *(ulong *)&rdata[uVar12].value;
        local_58 = rdata[uVar12].value.pointer.ptr;
        pcVar14 = (char *)p_Stack_70;
        if (SUB84(local_78,0) < 0xd) {
          pcVar14 = local_78 + 4;
        }
        uVar7 = (uint)local_60;
        __s2 = local_58;
        if (uVar7 < 0xd) {
          __s2 = (char *)((long)&local_60 + 4);
        }
        if (uVar7 == 0) {
          bVar16 = true;
        }
        else if (SUB84(local_78,0) < uVar7) {
          bVar16 = false;
        }
        else {
          iVar8 = bcmp(pcVar14,__s2,local_60 & 0xffffffff);
          bVar16 = iVar8 == 0;
          result_data = local_68;
          ldata = local_38;
          rdata = local_40;
        }
        result_data[uVar13] = bVar16;
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar13 = 0;
    local_48 = count;
    do {
      uVar9 = uVar13;
      if (psVar1 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar1[uVar13];
      }
      uVar12 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar13];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)))) {
        local_78 = *(undefined1 (*) [8])&ldata[uVar9].value;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar9].value.pointer.ptr;
        local_60 = *(ulong *)&rdata[uVar12].value;
        local_58 = rdata[uVar12].value.pointer.ptr;
        p_Var15 = p_Stack_70;
        if (SUB84(local_78,0) < 0xd) {
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 4);
        }
        uVar7 = (uint)local_60;
        pcVar14 = local_58;
        if (uVar7 < 0xd) {
          pcVar14 = (char *)((long)&local_60 + 4);
        }
        if (uVar7 == 0) {
          bVar16 = true;
        }
        else if (SUB84(local_78,0) < uVar7) {
          bVar16 = false;
        }
        else {
          iVar8 = bcmp(p_Var15,pcVar14,local_60 & 0xffffffff);
          bVar16 = iVar8 == 0;
          result_data = local_68;
        }
        result_data[uVar13] = bVar16;
      }
      else {
        _Var11._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_60 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_78,&local_60);
          p_Var6 = p_Stack_70;
          auVar5 = local_78;
          local_78 = (undefined1  [8])0x0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var15 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15),
             p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_50);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var11._M_head_impl;
          result_data = local_68;
          count = local_48;
        }
        bVar4 = (byte)uVar13 & 0x3f;
        _Var11._M_head_impl[uVar13 >> 6] =
             _Var11._M_head_impl[uVar13 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}